

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O2

int fetch_all_frequencies_db(feed_db_t *db,frequency_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  frequency_t *pfVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  sqlite3_stmt *stmt;
  uint local_e8;
  frequency_t record;
  char qr [83];
  
  bVar10 = 0;
  uVar2 = count_rows_db(db,"frequencies");
  if (0 < (int)uVar2) {
    pcVar8 = "SELECT trip_id, start_time, end_time,headway_secs, exact_times FROM `frequencies`;";
    pcVar9 = qr;
    for (lVar6 = 0x53; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pcVar9 = *pcVar8;
      pcVar8 = pcVar8 + (ulong)bVar10 * -2 + 1;
      pcVar9 = pcVar9 + (ulong)bVar10 * -2 + 1;
    }
    sqlite3_prepare_v2(db->conn,qr,-1,&stmt,(char **)0x0);
    pfVar4 = (frequency_t *)malloc((ulong)uVar2 * 0x5c);
    *records = pfVar4;
    uVar1 = 0xffffffff;
    if (pfVar4 != (frequency_t *)0x0) {
      lVar6 = 0;
      local_e8 = uVar2;
      do {
        iVar3 = sqlite3_step(stmt);
        db->rc = iVar3;
        uVar1 = local_e8;
        if (iVar3 != 100) break;
        init_frequency(&record);
        puVar5 = sqlite3_column_text(stmt,0);
        strcpy(record.trip_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,1);
        strcpy(record.start_time,(char *)puVar5);
        puVar5 = sqlite3_column_text(stmt,2);
        strcpy(record.end_time,(char *)puVar5);
        record.headway_secs = sqlite3_column_int(stmt,3);
        record.exact_times = sqlite3_column_int(stmt,4);
        pfVar4 = &record;
        pcVar8 = (*records)->trip_id + lVar6;
        for (lVar7 = 0x17; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pcVar8 = *(undefined4 *)pfVar4->trip_id;
          pfVar4 = (frequency_t *)((long)pfVar4 + (ulong)bVar10 * -8 + 4);
          pcVar8 = pcVar8 + ((ulong)bVar10 * -2 + 1) * 4;
        }
        lVar6 = lVar6 + 0x5c;
        uVar1 = local_e8;
      } while ((ulong)uVar2 * 0x5c - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(stmt);
  }
  return uVar2;
}

Assistant:

int fetch_all_frequencies_db(feed_db_t *db, frequency_t **records) {

    frequency_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "frequencies");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "trip_id, start_time, end_time,"
                    "headway_secs, exact_times "
                "FROM `frequencies`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_frequency(&record);

        strcpy(record.trip_id, sqlite3_column_text(stmt, 0));
        strcpy(record.start_time, sqlite3_column_text(stmt, 1));
        strcpy(record.end_time, sqlite3_column_text(stmt, 2));
        record.headway_secs = sqlite3_column_int(stmt, 3);
        record.exact_times = (time_exactness_t)sqlite3_column_int(stmt, 4);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}